

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int lhash_kv_open(unqlite_kv_engine *pEngine,pgno dbSize)

{
  unqlite_kv_engine *n64;
  uint *puVar1;
  uchar *zRaw;
  int iVar2;
  uint uVar3;
  undefined4 uVar4;
  uint uVar5;
  unqlite_kv_io *puVar6;
  unqlite_page *pHeader;
  unqlite_kv_engine local_40;
  unqlite_page *local_38;
  
  puVar6 = pEngine->pIo;
  if (dbSize == 0) {
    iVar2 = (*puVar6->xNew)(puVar6->pHandle,(unqlite_page **)&local_40);
    if ((iVar2 == 0) && (iVar2 = (*pEngine->pIo->xWrite)((unqlite_page *)local_40.pIo), iVar2 == 0))
    {
      puVar1 = (uint *)(local_40.pIo)->pHandle;
      pEngine[0x1a].pIo = local_40.pIo;
      uVar5 = *(uint *)&pEngine[0x27].pIo;
      *puVar1 = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
      uVar4 = (*(code *)pEngine[0x18].pIo)("chm@symisc",10);
      *(ushort *)((long)puVar1 + 6) = (ushort)uVar4 << 8 | (ushort)uVar4 >> 8;
      *(char *)((long)puVar1 + 5) = (char)((uint)uVar4 >> 0x10);
      *(char *)(puVar1 + 1) = (char)((uint)uVar4 >> 0x18);
      iVar2 = 0;
      puVar1[2] = 0;
      puVar1[3] = 0;
      puVar6 = pEngine[0x24].pIo;
      *(ulong *)(puVar1 + 4) =
           (ulong)puVar6 >> 0x38 | ((ulong)puVar6 & 0xff000000000000) >> 0x28 |
           ((ulong)puVar6 & 0xff0000000000) >> 0x18 | ((ulong)puVar6 & 0xff00000000) >> 8 |
           ((ulong)puVar6 & 0xff000000) << 8 | ((ulong)puVar6 & 0xff0000) << 0x18 |
           ((ulong)puVar6 & 0xff00) << 0x28 | (long)puVar6 << 0x38;
      puVar6 = pEngine[0x25].pIo;
      *(ulong *)(puVar1 + 6) =
           (ulong)puVar6 >> 0x38 | ((ulong)puVar6 & 0xff000000000000) >> 0x28 |
           ((ulong)puVar6 & 0xff0000000000) >> 0x18 | ((ulong)puVar6 & 0xff00000000) >> 8 |
           ((ulong)puVar6 & 0xff000000) << 8 | ((ulong)puVar6 & 0xff0000) << 0x18 |
           ((ulong)puVar6 & 0xff00) << 0x28 | (long)puVar6 << 0x38;
      pEngine[0x1f].pIo = (unqlite_kv_io *)(local_40.pIo)->xGet;
      puVar1[8] = 0;
      puVar1[9] = 0;
      puVar1[10] = 0;
      *(short *)&pEngine[0x20].pIo =
           ((short)puVar1 - (short)*(undefined4 *)&(local_40.pIo)->pHandle) + 0x2c;
    }
  }
  else {
    iVar2 = (*puVar6->xGet)(puVar6->pHandle,1,(unqlite_page **)&local_40);
    if (iVar2 == 0) {
      puVar1 = (uint *)(local_40.pIo)->pHandle;
      pEngine[0x1a].pIo = local_40.pIo;
      uVar5 = *puVar1;
      uVar5 = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
      *(uint *)&pEngine[0x27].pIo = uVar5;
      iVar2 = -0x18;
      if (uVar5 == 0xfa782dcb) {
        uVar5 = puVar1[1];
        uVar3 = (*(code *)pEngine[0x18].pIo)("chm@symisc",10);
        if (uVar3 == (uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 |
                     uVar5 << 0x18)) {
          SyBigEndianUnpack64((uchar *)(puVar1 + 2),(sxu64 *)(pEngine + 0x23));
          SyBigEndianUnpack64((uchar *)(puVar1 + 4),(sxu64 *)(pEngine + 0x24));
          SyBigEndianUnpack64((uchar *)(puVar1 + 6),(sxu64 *)(pEngine + 0x25));
          pEngine[0x26].pIo = (unqlite_kv_io *)((long)pEngine[0x25].pIo * 2);
          pEngine[0x1f].pIo = (unqlite_kv_io *)(local_40.pIo)->xGet;
          n64 = pEngine + 0x21;
          SyBigEndianUnpack64((uchar *)(puVar1 + 8),(sxu64 *)n64);
          uVar5 = puVar1[10];
          *(uint *)((long)&pEngine[0x20].pIo + 4) =
               uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
          zRaw = (uchar *)(local_40.pIo)->pHandle;
          *(short *)&pEngine[0x20].pIo = ((short)puVar1 - (short)zRaw) + 0x2c;
          iVar2 = lhMapLoadPage((lhash_kv_engine *)pEngine,(lhash_bmap_page *)(pEngine + 0x1f),zRaw)
          ;
          if (iVar2 == 0) {
            puVar6 = n64->pIo;
            if (puVar6 != (unqlite_kv_io *)0x0) {
              do {
                iVar2 = (*pEngine->pIo->xGet)(pEngine->pIo->pHandle,(pgno)puVar6,&local_38);
                if (iVar2 != 0) {
                  return iVar2;
                }
                pEngine[0x1f].pIo = puVar6;
                *(undefined2 *)&pEngine[0x20].pIo = 0;
                iVar2 = lhMapLoadPage((lhash_kv_engine *)pEngine,(lhash_bmap_page *)(pEngine + 0x1f)
                                      ,local_38->zData);
                if (iVar2 != 0) {
                  return iVar2;
                }
                puVar6 = n64->pIo;
              } while (puVar6 != (unqlite_kv_io *)0x0);
            }
            iVar2 = 0;
          }
        }
        else {
          (*pEngine->pIo->xErr)(pEngine->pIo->pHandle,"Invalid hash function");
          iVar2 = -9;
        }
      }
    }
  }
  return iVar2;
}

Assistant:

static int lhash_kv_open(unqlite_kv_engine *pEngine,pgno dbSize)
{
	lhash_kv_engine *pHash = (lhash_kv_engine *)pEngine;
	unqlite_page *pHeader;
	int rc;
	if( dbSize < 1 ){
		/* A new database, create the header */
		rc = pEngine->pIo->xNew(pEngine->pIo->pHandle,&pHeader);
		if( rc != UNQLITE_OK ){
			return rc;
		}
		/* Acquire a writer lock */
		rc = pEngine->pIo->xWrite(pHeader);
		if( rc != UNQLITE_OK ){
			return rc;
		}
		/* Write the hash header */
		rc = lhash_write_header(pHash,pHeader);
		if( rc != UNQLITE_OK ){
			return rc;
		}
	}else{
		/* Acquire the page one of the database */
		rc = pEngine->pIo->xGet(pEngine->pIo->pHandle,1,&pHeader);
		if( rc != UNQLITE_OK ){
			return rc;
		}
		/* Read the database header */
		rc = lhash_read_header(pHash,pHeader);
		if( rc != UNQLITE_OK ){
			return rc;
		}
	}
	return UNQLITE_OK;
}